

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNlsolver.cpp
# Opt level: O2

double chrono::ChNonlinearSolver::NewtonRaphson
                 (_func_void_ChVectorRef_ChVectorRef_void_ptr *m_func,
                 _func_void_ChVectorRef_ChMatrixRef_void_ptr *m_jacob,ChVectorRef *mx,void *my_data,
                 int maxiters,double tolerance)

{
  Index newSize;
  ChVectorRef CVar1;
  ChVectorRef CVar2;
  ChVectorRef CVar3;
  ChMatrixRef CVar4;
  uint uVar5;
  bool bVar6;
  ChVectorDynamic<> res;
  ChMatrixDynamic<> jac;
  ChVectorDynamic<> delta;
  undefined8 in_stack_fffffffffffffdd8;
  RealScalar RVar7;
  double *ptr;
  Index IVar8;
  double *ptr_00;
  Index IVar9;
  void *local_1d8;
  undefined8 uStack_1d0;
  double local_1c0;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_1b8;
  ChVectorRef local_1a8;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined1 local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158;
  ChVectorRef local_150;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_138 [24];
  ChMatrixRef local_120;
  Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> local_f8 [40];
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_d0;
  
  ptr = (double *)0x0;
  IVar8 = 0;
  local_1d8 = (void *)0x0;
  uStack_1d0 = 0;
  ptr_00 = (double *)0x0;
  IVar9 = 0;
  newSize = *(Index *)&(mx->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                       ).field_0x8;
  local_1c0 = tolerance;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&stack0xfffffffffffffde8,
             newSize);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&stack0xfffffffffffffe08,
             newSize,newSize);
  uVar5 = ~(maxiters >> 0x1f) & maxiters;
  RVar7 = 0.0;
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    local_158 = (mx->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ).field_0x10;
    local_168 = *(undefined8 *)
                 &mx->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ;
    uStack_160 = *(undefined8 *)
                  &(mx->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ).field_0x8;
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              (local_138,
               (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&stack0xfffffffffffffde8,
               (type *)0x0);
    CVar1.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
    _8_8_ = RVar7;
    CVar1.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
    _0_8_ = in_stack_fffffffffffffdd8;
    CVar1.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
    _16_8_ = ptr;
    CVar3.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
    _8_8_ = m_func;
    CVar3.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
    _0_8_ = IVar8;
    CVar3.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
    _16_8_ = m_jacob;
    (*m_func)(CVar1,CVar3,&local_168);
    RVar7 = Eigen::internal::lpNorm_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::run
                      ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                       &stack0xfffffffffffffde8);
    if (RVar7 <= local_1c0) break;
    if (m_jacob == (_func_void_ChVectorRef_ChMatrixRef_void_ptr *)0x0) {
      local_1a8.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _16_1_ = (mx->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ).field_0x10;
      local_1a8.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _0_8_ = *(undefined8 *)
               &mx->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ;
      local_1a8.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _8_8_ = *(undefined8 *)
               &(mx->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ).field_0x8;
      Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
      Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_150,
                 (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                 &stack0xfffffffffffffde8,(type *)0x0);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_120,
                 (PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                 &stack0xfffffffffffffe08,(type *)0x0);
      JacobianCompute(m_func,&local_1a8,&local_150,my_data,&local_120,1e-07);
    }
    else {
      local_178 = (mx->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ).field_0x10;
      local_188 = *(undefined8 *)
                   &mx->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ;
      uStack_180 = *(undefined8 *)
                    &(mx->
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ).field_0x8;
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                (local_f8,(PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                          &stack0xfffffffffffffe08,(type *)0x0);
      CVar2.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _8_8_ = RVar7;
      CVar2.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _0_8_ = in_stack_fffffffffffffdd8;
      CVar2.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _16_8_ = ptr;
      CVar4.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = (long)m_func;
      CVar4.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)IVar8;
      CVar4.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = (long)m_jacob;
      CVar4.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = (long)ptr_00;
      CVar4.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride._8_8_ = IVar9;
      (*m_jacob)(CVar2,CVar4,&local_188);
    }
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
    ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_d0,
               (EigenBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&stack0xfffffffffffffe08);
    local_1b8 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::
                solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                          ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
                            *)&local_d0,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                           &stack0xfffffffffffffde8);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_1d8,&local_1b8);
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::~ColPivHouseholderQR
              (&local_d0);
    Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>>::
    operator-=((MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>> *)
               mx,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1d8);
  }
  Eigen::internal::handmade_aligned_free(ptr_00);
  Eigen::internal::handmade_aligned_free(local_1d8);
  Eigen::internal::handmade_aligned_free(ptr);
  return RVar7;
}

Assistant:

double ChNonlinearSolver::NewtonRaphson(void (*m_func)(ChVectorRef mx, ChVectorRef res, void* my_data),
                                        void (*m_jacob)(ChVectorRef mx, ChMatrixRef mJ, void* my_data),
                                        ChVectorRef mx,
                                        void* my_data,
                                        int maxiters,
                                        double tolerance) {
    ChVectorDynamic<> res;
    ChVectorDynamic<> delta;
    ChMatrixDynamic<> jac;

    auto vars = mx.size();
    res.setZero(vars);
    jac.setZero(vars, vars);

    int iters = 0;
    double residual = 0;

    while (true) {
        if (iters >= maxiters)
            break;

        // compute residuals
        (*m_func)(mx, res, my_data);
        residual = res.lpNorm<Eigen::Infinity>();
        if (residual <= tolerance)
            break;

        // compute jacobian
        if (m_jacob)
            (*m_jacob)(mx, jac, my_data);
        else {
            ChNonlinearSolver::JacobianCompute(m_func, mx, res, my_data, jac, BDF_STEP_LOW);
        }

        // solve jac * delta = res
        delta = jac.colPivHouseholderQr().solve(res);
        mx -= delta;

        iters++;
    }
    return residual;
}